

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Segment::MakeNewCluster(Segment *this,uint64_t frame_timestamp_ns)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  ulong uVar4;
  Cluster **ppCVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  int64_t cues_pos;
  Cluster *this_00;
  Cluster *local_c0;
  int local_ac;
  int64_t offset;
  Cluster **cluster;
  uint64_t tc;
  uint64_t ns;
  Frame *f;
  uint64_t cluster_timecode;
  uint64_t frame_timecode;
  uint64_t timecode_scale;
  Cluster *old_cluster;
  int32_t i;
  Cluster **clusters;
  int32_t new_capacity;
  int32_t new_size;
  uint64_t frame_timestamp_ns_local;
  Segment *this_local;
  
  iVar3 = this->cluster_list_size_ + 1;
  if (this->cluster_list_capacity_ < iVar3) {
    if (this->cluster_list_capacity_ < 1) {
      local_ac = 1;
    }
    else {
      local_ac = this->cluster_list_capacity_ << 1;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)local_ac;
    uVar4 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    ppCVar5 = (Cluster **)operator_new__(uVar4,(nothrow_t *)&std::nothrow);
    if (ppCVar5 == (Cluster **)0x0) {
      return false;
    }
    for (old_cluster._4_4_ = 0; old_cluster._4_4_ < this->cluster_list_size_;
        old_cluster._4_4_ = old_cluster._4_4_ + 1) {
      ppCVar5[old_cluster._4_4_] = this->cluster_list_[old_cluster._4_4_];
    }
    if (this->cluster_list_ != (Cluster **)0x0) {
      operator_delete__(this->cluster_list_);
    }
    this->cluster_list_ = ppCVar5;
    this->cluster_list_capacity_ = local_ac;
  }
  bVar2 = WriteFramesLessThan(this,frame_timestamp_ns);
  if (bVar2) {
    if ((this->cluster_list_size_ < 1) ||
       ((this->cluster_list_[this->cluster_list_size_ + -1] != (Cluster *)0x0 &&
        (bVar2 = Cluster::Finalize(this->cluster_list_[this->cluster_list_size_ + -1],true,
                                   frame_timestamp_ns), bVar2)))) {
      if ((this->output_cues_ & 1U) != 0) {
        this->new_cuepoint_ = true;
      }
      if (((this->chunking_ & 1U) != 0) && (0 < this->cluster_list_size_)) {
        MkvWriter::Close(this->chunk_writer_cluster_);
        this->chunk_count_ = this->chunk_count_ + 1;
        bVar2 = UpdateChunkName(this,"chk",&this->chunk_name_);
        if (!bVar2) {
          return false;
        }
        bVar2 = MkvWriter::Open(this->chunk_writer_cluster_,this->chunk_name_);
        if (!bVar2) {
          return false;
        }
      }
      uVar6 = SegmentInfo::timecode_scale(&this->segment_info_);
      f = (Frame *)(frame_timestamp_ns / uVar6);
      if (0 < this->frames_size_) {
        uVar7 = Frame::timestamp(*this->frames_);
        if ((Frame *)(uVar7 / uVar6) < f) {
          f = (Frame *)(uVar7 / uVar6);
        }
      }
      ppCVar5 = this->cluster_list_ + this->cluster_list_size_;
      cues_pos = MaxOffset(this);
      this_00 = (Cluster *)operator_new(0xa0,(nothrow_t *)&std::nothrow);
      local_c0 = (Cluster *)0x0;
      if (this_00 != (Cluster *)0x0) {
        uVar6 = SegmentInfo::timecode_scale(&this->segment_info_);
        Cluster::Cluster(this_00,(uint64_t)f,cues_pos,uVar6,
                         (bool)(this->accurate_cluster_duration_ & 1),
                         (bool)(this->fixed_size_cluster_timecode_ & 1));
        local_c0 = this_00;
      }
      *ppCVar5 = local_c0;
      if (*ppCVar5 == (Cluster *)0x0) {
        this_local._7_1_ = false;
      }
      else {
        bVar2 = Cluster::Init(*ppCVar5,this->writer_cluster_);
        if (bVar2) {
          this->cluster_list_size_ = iVar3;
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Segment::MakeNewCluster(uint64_t frame_timestamp_ns) {
  const int32_t new_size = cluster_list_size_ + 1;

  if (new_size > cluster_list_capacity_) {
    // Add more clusters.
    const int32_t new_capacity =
        (cluster_list_capacity_ <= 0) ? 1 : cluster_list_capacity_ * 2;
    Cluster** const clusters =
        new (std::nothrow) Cluster*[new_capacity];  // NOLINT
    if (!clusters)
      return false;

    for (int32_t i = 0; i < cluster_list_size_; ++i) {
      clusters[i] = cluster_list_[i];
    }

    delete[] cluster_list_;

    cluster_list_ = clusters;
    cluster_list_capacity_ = new_capacity;
  }

  if (!WriteFramesLessThan(frame_timestamp_ns))
    return false;

  if (cluster_list_size_ > 0) {
    // Update old cluster's size
    Cluster* const old_cluster = cluster_list_[cluster_list_size_ - 1];

    if (!old_cluster || !old_cluster->Finalize(true, frame_timestamp_ns))
      return false;
  }

  if (output_cues_)
    new_cuepoint_ = true;

  if (chunking_ && cluster_list_size_ > 0) {
    chunk_writer_cluster_->Close();
    chunk_count_++;

    if (!UpdateChunkName("chk", &chunk_name_))
      return false;
    if (!chunk_writer_cluster_->Open(chunk_name_))
      return false;
  }

  const uint64_t timecode_scale = segment_info_.timecode_scale();
  const uint64_t frame_timecode = frame_timestamp_ns / timecode_scale;

  uint64_t cluster_timecode = frame_timecode;

  if (frames_size_ > 0) {
    const Frame* const f = frames_[0];  // earliest queued frame
    const uint64_t ns = f->timestamp();
    const uint64_t tc = ns / timecode_scale;

    if (tc < cluster_timecode)
      cluster_timecode = tc;
  }

  Cluster*& cluster = cluster_list_[cluster_list_size_];
  const int64_t offset = MaxOffset();
  cluster = new (std::nothrow)
      Cluster(cluster_timecode, offset, segment_info_.timecode_scale(),
              accurate_cluster_duration_, fixed_size_cluster_timecode_);
  if (!cluster)
    return false;

  if (!cluster->Init(writer_cluster_))
    return false;

  cluster_list_size_ = new_size;
  return true;
}